

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jedi.cpp
# Opt level: O0

int drawDisplayStringList(void)

{
  char *local_20;
  char *c;
  int y;
  int sx;
  int x;
  int w;
  
  drawMap();
  y = 5;
  c._0_4_ = (display_string_list_line_count * -6 + 0x40) / 2;
  fillBox(3,(int)c + -2,0x7c,display_string_list_line_count * 6 + 5,0xff);
  fillBox(4,(int)c + -1,0x7a,display_string_list_line_count * 6 + 2,'\0');
  for (local_20 = display_string_list_buffer; *local_20 != '\0'; local_20 = local_20 + 1) {
    if (*local_20 == '\n') {
      y = 5;
      c._0_4_ = (int)c + 6;
    }
    else {
      drawChar(y,(int)c,(int)*local_20);
      y = y + 4;
    }
  }
  return (int)c;
}

Assistant:

static int drawDisplayStringList()
{
    drawMap();
    int w = 30 * 4;
    int x = 5;
    int sx = x;
    int y = (DISPLAY_HEIGHT-display_string_list_line_count*6) / 2;
    fillBox(x - 2, y - 2, w + 4, display_string_list_line_count * 6 + 5, 255);
    fillBox(x - 1, y - 1, w + 2, display_string_list_line_count * 6 + 2, 0);
    for(char* c=display_string_list_buffer; *c; c++)
    {
        if (*c == '\n')
        {
            x = sx;
            y += 6;
        }else{
            drawChar(x, y, *c);
            x+=4;
        }
    }
    return y;
}